

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chess.cpp
# Opt level: O0

void __thiscall
Position::HandleEnPassant(Position *this,Move *move,Position *position,Square *captureSquare)

{
  bool bVar1;
  Color CVar2;
  int iVar3;
  int iVar4;
  Square local_78;
  Square local_70;
  Square local_68;
  int local_60;
  Square SStack_5c;
  int d;
  Square local_54;
  Square local_4c;
  Square local_44;
  Square enPassant;
  Square local_34;
  int local_2c;
  Square *pSStack_28;
  int pawnMoveDistance;
  Square *captureSquare_local;
  Position *position_local;
  Move *move_local;
  Position *this_local;
  
  pSStack_28 = captureSquare;
  captureSquare_local = (Square *)position;
  position_local = (Position *)move;
  move_local = (Move *)this;
  local_34 = Move::Dest(move);
  iVar3 = Square::J(&local_34);
  enPassant = Move::Source((Move *)position_local);
  local_2c = Square::J(&enPassant);
  local_2c = iVar3 - local_2c;
  iVar3 = local_2c;
  if (local_2c < 1) {
    iVar3 = -local_2c;
  }
  if (iVar3 < 2) {
    SStack_5c = Move::Dest((Move *)position_local);
    bVar1 = Square::operator==(&stack0xffffffffffffffa4,(Square *)&captureSquare_local[0x4c].j);
    if (bVar1) {
      CVar2 = GetColorToMove((Position *)captureSquare_local);
      local_60 = 1;
      if (CVar2) {
        local_60 = -1;
      }
      local_70 = Move::Dest((Move *)position_local);
      iVar3 = Square::I(&local_70);
      local_78 = Move::Dest((Move *)position_local);
      iVar4 = Square::J(&local_78);
      Square::Square(&local_68,iVar3,iVar4 + local_60);
      *pSStack_28 = local_68;
      CaptureMaterial(this,(Position *)captureSquare_local,pSStack_28);
      iVar3 = Square::I(pSStack_28);
      iVar4 = Square::J(pSStack_28);
      BoardHashing::Set((BoardHashing *)&this->m_Board,iVar3,iVar4,&None.super_Piece);
    }
    else {
      CaptureMaterial(this,(Position *)captureSquare_local,pSStack_28);
    }
  }
  else {
    local_2c = local_2c >> 1;
    local_4c = Move::Source((Move *)position_local);
    iVar3 = Square::I(&local_4c);
    local_54 = Move::Source((Move *)position_local);
    iVar4 = Square::J(&local_54);
    Square::Square(&local_44,iVar3,iVar4 + local_2c);
    this->m_sEnPassant = local_44;
  }
  return;
}

Assistant:

void HandleEnPassant( const Move &move, const Position &position,
                          Square &captureSquare )
    {
        /* Did the pawn just move two spaces?  If so, record this fact in the position */
        int pawnMoveDistance;
        pawnMoveDistance = move.Dest().J() - move.Source().J();

        if ( abs( pawnMoveDistance ) > 1 )
        {
            /* Halfway between the start and the end */
            pawnMoveDistance = pawnMoveDistance >> 1;
            Square enPassant( move.Source().I(), move.Source().J() + pawnMoveDistance );
            m_sEnPassant = enPassant;
        }

        /* Did the pawn just move into the previous en passant square?  If so, capture */
        else if ( move.Dest() == position.m_sEnPassant )
        {
            /* Capture the pawn behind it */
            int d = position.GetColorToMove() ? -1 : 1;
            captureSquare = Square( move.Dest().I(), move.Dest().J() + d );
            /* FIXME This line doesn't seem to get the material right in the case of an en passant */
            CaptureMaterial( position, captureSquare );
            m_Board.Set( captureSquare.I(), captureSquare.J(), &None );
        }
        else
        {
            /* Not en passant.  Regardless of whether there's a capture or not,
            * bump the material score by the captured square
            */
            CaptureMaterial( position, captureSquare );
        }
    }